

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportCommand.cxx
# Opt level: O3

bool __thiscall
cmExportCommand::HandlePackage
          (cmExportCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  bool bVar4;
  bool bVar5;
  PolicyStatus PVar6;
  ostream *poVar7;
  string *input;
  string package;
  string hash;
  RegularExpression packageRegex;
  string local_2b0;
  string local_290;
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [6];
  ios_base local_200 [264];
  undefined1 local_f8 [80];
  char *local_a8;
  char *local_58;
  char *local_38;
  
  paVar1 = &local_2b0.field_2;
  local_2b0._M_string_length = 0;
  local_2b0.field_2._M_local_buf[0] = '\0';
  local_2b0._M_dataplus._M_p = (pointer)paVar1;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
LAB_0022da89:
    local_270._0_8_ = local_270 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_270,"PACKAGE must be given a package name.","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_270);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_260[0]._M_allocated_capacity + 1);
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)&local_2b0);
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
      if (local_2b0._M_string_length != 0) {
        local_f8._0_8_ = (pointer)0x0;
        local_a8 = (char *)0x0;
        local_58 = (char *)0x0;
        local_38 = (char *)0x0;
        cmsys::RegularExpression::compile((RegularExpression *)local_f8,"^[A-Za-z0-9_.-]+$");
        bVar4 = cmsys::RegularExpression::find
                          ((RegularExpression *)local_f8,local_2b0._M_dataplus._M_p,
                           (RegularExpressionMatch *)local_f8);
        if (bVar4) {
          PVar6 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0090,false);
          if (PVar6 - NEW < 3) {
            pcVar3 = (this->super_cmCommand).Makefile;
            local_270._0_8_ = local_270 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_270,"CMAKE_EXPORT_PACKAGE_REGISTRY","");
            bVar5 = cmMakefile::IsOn(pcVar3,(string *)local_270);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,local_260[0]._M_allocated_capacity + 1);
            }
            if (!bVar5) goto LAB_0022dc7a;
          }
          else if (PVar6 < NEW) {
            pcVar3 = (this->super_cmCommand).Makefile;
            local_270._0_8_ = local_270 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_270,"CMAKE_EXPORT_NO_PACKAGE_REGISTRY","");
            bVar5 = cmMakefile::IsOn(pcVar3,(string *)local_270);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,local_260[0]._M_allocated_capacity + 1);
            }
            if (bVar5) goto LAB_0022dc7a;
          }
          input = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile)
          ;
          cmSystemTools::ComputeStringMD5((string *)local_270,input);
          StorePackageRegistryDir(this,&local_2b0,(input->_M_dataplus)._M_p,(char *)local_270._0_8_)
          ;
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,local_260[0]._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_270,"PACKAGE given invalid package name \"",0x24);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_270,local_2b0._M_dataplus._M_p,
                              local_2b0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"Package names must match \"",0x1a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"^[A-Za-z0-9_.-]+$",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_290);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
          std::ios_base::~ios_base(local_200);
        }
LAB_0022dc7a:
        if (local_38 != (char *)0x0) {
          operator_delete__(local_38);
        }
        goto LAB_0022dad0;
      }
      goto LAB_0022da89;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_270,"PACKAGE given unknown argument: ",0x20);
    pbVar2 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_270,pbVar2[2]._M_dataplus._M_p,pbVar2[2]._M_string_length);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)local_f8);
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
    std::ios_base::~ios_base(local_200);
  }
  bVar4 = false;
LAB_0022dad0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2b0._M_dataplus._M_p,
                    CONCAT71(local_2b0.field_2._M_allocated_capacity._1_7_,
                             local_2b0.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool cmExportCommand::HandlePackage(std::vector<std::string> const& args)
{
  // Parse PACKAGE mode arguments.
  enum Doing
  {
    DoingNone,
    DoingPackage
  };
  Doing doing = DoingPackage;
  std::string package;
  for (unsigned int i = 1; i < args.size(); ++i) {
    if (doing == DoingPackage) {
      package = args[i];
      doing = DoingNone;
    } else {
      std::ostringstream e;
      e << "PACKAGE given unknown argument: " << args[i];
      this->SetError(e.str());
      return false;
    }
  }

  // Verify the package name.
  if (package.empty()) {
    this->SetError("PACKAGE must be given a package name.");
    return false;
  }
  const char* packageExpr = "^[A-Za-z0-9_.-]+$";
  cmsys::RegularExpression packageRegex(packageExpr);
  if (!packageRegex.find(package)) {
    std::ostringstream e;
    e << "PACKAGE given invalid package name \"" << package << "\".  "
      << "Package names must match \"" << packageExpr << "\".";
    this->SetError(e.str());
    return false;
  }

  // CMP0090 decides both the default and what variable changes it.
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0090)) {
    case cmPolicies::WARN:
    case cmPolicies::OLD:
      // Default is to export, but can be disabled.
      if (this->Makefile->IsOn("CMAKE_EXPORT_NO_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      // Default is to not export, but can be enabled.
      if (!this->Makefile->IsOn("CMAKE_EXPORT_PACKAGE_REGISTRY")) {
        return true;
      }
      break;
  }

  // We store the current build directory in the registry as a value
  // named by a hash of its own content.  This is deterministic and is
  // unique with high probability.
  const std::string& outDir = this->Makefile->GetCurrentBinaryDirectory();
  std::string hash = cmSystemTools::ComputeStringMD5(outDir);
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->StorePackageRegistryWin(package, outDir.c_str(), hash.c_str());
#else
  this->StorePackageRegistryDir(package, outDir.c_str(), hash.c_str());
#endif

  return true;
}